

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void Am_Connection::Reset(void)

{
  fd_set *pfVar1;
  fd_set *__arr;
  uint __i;
  
  connection_list = (Connection_List_Ptr)0x0;
  num_sockets = 0;
  max_socket = 0;
  m_parent_socket = 0;
  id_count = 0;
  pfVar1 = (fd_set *)operator_new(0x80);
  socket_flags = pfVar1;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    pfVar1->fds_bits[__arr._4_4_] = 0;
  }
  Register_Default_Methods();
  return;
}

Assistant:

void
Am_Connection::Reset(void)
{
  connection_list = nullptr;
  num_sockets = 0;
  max_socket = 0;
  m_parent_socket = 0;
  id_count = 0;
  socket_flags = new fd_set;
  FD_ZERO(socket_flags);
  Register_Default_Methods();
}